

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserFilter.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserFilter::ParseValue
          (PropertyParserFilter *this,Property *property,String *filter_string_value,
          ParameterMap *param_3)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  size_type __n;
  reference pbVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool local_289;
  undefined1 local_278 [56];
  FilterDeclaration local_240;
  String local_1e8;
  allocator<char> local_1c1;
  String local_1c0;
  undefined1 local_1a0 [8];
  PropertyDictionary properties;
  PropertySpecification *specification;
  String shorthand;
  FilterInstancer *instancer;
  undefined1 local_120 [8];
  String type;
  bool invalid_parenthesis;
  size_t shorthand_close;
  size_t shorthand_open;
  String *filter_string;
  iterator __end1;
  iterator __begin1;
  StringList *__range1;
  FilterDeclarationList filters;
  StringList filter_string_list;
  shared_ptr<const_Rml::FilterDeclarationList> local_68;
  Variant local_58;
  ParameterMap *local_30;
  ParameterMap *param_3_local;
  String *filter_string_value_local;
  Property *property_local;
  PropertyParserFilter *this_local;
  
  local_30 = param_3;
  param_3_local = (ParameterMap *)filter_string_value;
  filter_string_value_local = (String *)property;
  property_local = (Property *)this;
  uVar4 = ::std::__cxx11::string::empty();
  if (((uVar4 & 1) != 0) ||
     (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )param_3_local,"none"), bVar2)) {
    ::std::shared_ptr<const_Rml::FilterDeclarationList>::shared_ptr(&local_68);
    Variant::Variant<std::shared_ptr<Rml::FilterDeclarationList_const>,void>(&local_58,&local_68);
    Variant::operator=((Variant *)filter_string_value_local,&local_58);
    Variant::~Variant(&local_58);
    ::std::shared_ptr<const_Rml::FilterDeclarationList>::~shared_ptr(&local_68);
    *(undefined4 *)&filter_string_value_local[1]._M_string_length = 0x1000000;
    this_local._7_1_ = 1;
  }
  else {
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(filters.value.field_2._M_local_buf + 8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(pvVar1);
    StringUtilities::ExpandString((StringList *)pvVar1,(String *)param_3_local,' ','(',')',true);
    FilterDeclarationList::FilterDeclarationList((FilterDeclarationList *)&__range1);
    ::std::__cxx11::string::operator=
              ((string *)
               &filters.list.
                super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)param_3_local);
    __n = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(filters.value.field_2._M_local_buf + 8));
    ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::reserve
              ((vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_> *)&__range1,
               __n);
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(filters.value.field_2._M_local_buf + 8);
    __end1 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar1);
    filter_string =
         (String *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&filter_string), bVar2) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      uVar4 = ::std::__cxx11::string::find((char)pbVar5,0x28);
      uVar6 = ::std::__cxx11::string::rfind((char)pbVar5,0x29);
      local_289 = true;
      if ((uVar4 != 0xffffffffffffffff) && (local_289 = true, uVar6 != 0xffffffffffffffff)) {
        local_289 = uVar6 <= uVar4;
      }
      type.field_2._M_local_buf[0xf] = local_289;
      if (local_289 != false) {
        uVar7 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Invalid syntax for font-effect \'%s\'.",uVar7);
        this_local._7_1_ = 0;
        type.field_2._8_4_ = 1;
        goto LAB_005efe47;
      }
      ::std::__cxx11::string::substr((ulong)&instancer,(ulong)pbVar5);
      StringUtilities::StripWhitespace((String *)local_120,(String *)&instancer);
      ::std::__cxx11::string::~string((string *)&instancer);
      shorthand.field_2._8_8_ = Factory::GetFilterInstancer((String *)local_120);
      if ((FilterInstancer *)shorthand.field_2._8_8_ == (FilterInstancer *)0x0) {
        uVar7 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Filter type \'%s\' not found.",uVar7);
        this_local._7_1_ = 0;
        type.field_2._8_4_ = 1;
      }
      else {
        ::std::__cxx11::string::substr((ulong)&specification,(ulong)pbVar5);
        properties.properties._40_8_ =
             EffectSpecification::GetPropertySpecification
                       ((EffectSpecification *)(shorthand.field_2._8_8_ + 8));
        PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_1a0);
        uVar7 = properties.properties._40_8_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"filter",&local_1c1);
        bVar2 = PropertySpecification::ParsePropertyDeclaration
                          ((PropertySpecification *)uVar7,(PropertyDictionary *)local_1a0,&local_1c0
                           ,(String *)&specification);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::allocator<char>::~allocator(&local_1c1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_005efc8d:
          PropertySpecification::SetPropertyDefaults
                    ((PropertySpecification *)properties.properties._40_8_,
                     (PropertyDictionary *)local_1a0);
          ::std::__cxx11::string::string((string *)&local_240,(string *)local_120);
          local_240.instancer = (FilterInstancer *)shorthand.field_2._8_8_;
          PropertyDictionary::PropertyDictionary
                    (&local_240.properties,(PropertyDictionary *)local_1a0);
          ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::
          emplace_back<Rml::FilterDeclaration>
                    ((vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_> *)
                     &__range1,&local_240);
          FilterDeclaration::~FilterDeclaration(&local_240);
          type.field_2._8_4_ = 0;
        }
        else {
          StringUtilities::StripWhitespace(&local_1e8,(String *)&specification);
          bVar3 = ::std::__cxx11::string::empty();
          ::std::__cxx11::string::~string((string *)&local_1e8);
          if (((bVar3 ^ 0xff) & 1) == 0) goto LAB_005efc8d;
          this_local._7_1_ = 0;
          type.field_2._8_4_ = 1;
        }
        PropertyDictionary::~PropertyDictionary((PropertyDictionary *)local_1a0);
        ::std::__cxx11::string::~string((string *)&specification);
      }
      ::std::__cxx11::string::~string((string *)local_120);
      if (type.field_2._8_4_ != 0) goto LAB_005efe47;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    bVar2 = ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::empty
                      ((vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_> *)
                       &__range1);
    if (bVar2) {
      this_local._7_1_ = 0;
      type.field_2._8_4_ = 1;
    }
    else {
      MakeShared<Rml::FilterDeclarationList,Rml::FilterDeclarationList>
                ((FilterDeclarationList *)local_278);
      Variant::Variant<std::shared_ptr<Rml::FilterDeclarationList>,void>
                ((Variant *)(local_278 + 0x10),(shared_ptr<Rml::FilterDeclarationList> *)local_278);
      Variant::operator=((Variant *)filter_string_value_local,(Variant *)(local_278 + 0x10));
      Variant::~Variant((Variant *)(local_278 + 0x10));
      ::std::shared_ptr<Rml::FilterDeclarationList>::~shared_ptr
                ((shared_ptr<Rml::FilterDeclarationList> *)local_278);
      *(undefined4 *)&filter_string_value_local[1]._M_string_length = 0x1000000;
      this_local._7_1_ = 1;
      type.field_2._8_4_ = 1;
    }
LAB_005efe47:
    FilterDeclarationList::~FilterDeclarationList((FilterDeclarationList *)&__range1);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(filters.value.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertyParserFilter::ParseValue(Property& property, const String& filter_string_value, const ParameterMap& /*parameters*/) const
{
	// Filters are declared as
	//   filter: <filter-value>[ <filter-value> ...];
	// Where <filter-value> is specified with inline properties
	//   filter: brightness( <shorthand properties> ) ...;

	if (filter_string_value.empty() || filter_string_value == "none")
	{
		property.value = Variant(FiltersPtr());
		property.unit = Unit::FILTER;
		return true;
	}

	RMLUI_ZoneScoped;

	// Make sure we don't split inside the parenthesis since they may appear in filter shorthands.
	StringList filter_string_list;
	StringUtilities::ExpandString(filter_string_list, filter_string_value, ' ', '(', ')', true);

	FilterDeclarationList filters;
	filters.value = filter_string_value;
	filters.list.reserve(filter_string_list.size());

	// Get or instance each filter in the comma-separated string list
	for (const String& filter_string : filter_string_list)
	{
		const size_t shorthand_open = filter_string.find('(');
		const size_t shorthand_close = filter_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);

		if (invalid_parenthesis)
		{
			// We found no parenthesis, filters can only be declared anonymously for now.
			Log::Message(Log::LT_WARNING, "Invalid syntax for font-effect '%s'.", filter_string.c_str());
			return false;
		}
		else
		{
			const String type = StringUtilities::StripWhitespace(filter_string.substr(0, shorthand_open));

			// Check for valid filter type
			FilterInstancer* instancer = Factory::GetFilterInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Filter type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = filter_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'filter' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "filter", shorthand))
			{
				// Empty values are allowed in filters, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
					return false;
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			filters.list.emplace_back(FilterDeclaration{type, instancer, std::move(properties)});
		}
	}

	if (filters.list.empty())
		return false;

	property.value = Variant(MakeShared<FilterDeclarationList>(std::move(filters)));
	property.unit = Unit::FILTER;

	return true;
}